

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O2

void BinaryenConstSetValueI64High(BinaryenExpressionRef expr,int32_t valueHigh)

{
  ulong uVar1;
  anon_union_16_6_1532cd5a_for_Literal_0 local_30;
  undefined8 local_20;
  
  if (expr->_id == ConstId) {
    if (*(long *)(expr + 2) == 3) {
      uVar1 = wasm::Literal::geti64((Literal *)(expr + 1));
      uVar1 = uVar1 & 0xffffffff;
    }
    else {
      uVar1 = 0;
    }
    local_30.func.super_IString.str._M_len = (ulong)(uint)valueHigh << 0x20 | uVar1;
    local_20 = 3;
    wasm::Literal::operator=((Literal *)(expr + 1),(Literal *)&local_30.func);
    wasm::Literal::~Literal((Literal *)&local_30.func);
    return;
  }
  __assert_fail("expression->is<Const>()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                ,0xadf,"void BinaryenConstSetValueI64High(BinaryenExpressionRef, int32_t)");
}

Assistant:

void BinaryenConstSetValueI64High(BinaryenExpressionRef expr,
                                  int32_t valueHigh) {
  auto* expression = (Expression*)expr;
  assert(expression->is<Const>());
  auto& value = static_cast<Const*>(expression)->value;
  int64_t valueI64 = value.type == Type::i64 ? value.geti64() : 0;
  static_cast<Const*>(expression)->value =
    Literal((int64_t(valueHigh) << 32) | (valueI64 & 0xffffffff));
}